

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::JobManager::PrepareJobs
          (Error *__return_storage_ptr__,JobManager *this,Expression *aExpr,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *aNids,bool aGroupAlias)

{
  ErrorCode EVar1;
  pointer puVar2;
  uint64_t uVar3;
  bool bVar4;
  byte bVar5;
  iterator iVar6;
  Error *pEVar7;
  pointer __k;
  string *this_00;
  int iVar8;
  Error importError;
  Expression jobExpr;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [16];
  string local_90;
  string local_70;
  string local_50;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  this_00 = (string *)&__return_storage_ptr__->mMessage;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  utils::ToLower((string *)&importError,
                 (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start);
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &importError,"start");
  std::__cxx11::string::~string((string *)&importError);
  if (bVar4) {
    PrepareStartJobs(&importError,this,aExpr,aNids,aGroupAlias);
  }
  else {
    utils::ToLower((string *)&importError,
                   (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start);
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &importError,"stop");
    std::__cxx11::string::~string((string *)&importError);
    if (!bVar4) {
      __k = (aNids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
      puVar2 = (aNids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      while( true ) {
        if (__k == puVar2) {
          return __return_storage_ptr__;
        }
        iVar6 = std::
                _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>_>
                ::find(&(this->mCommissionerPool)._M_t,__k);
        if ((_Rb_tree_header *)iVar6._M_node !=
            &(this->mCommissionerPool)._M_t._M_impl.super__Rb_tree_header) break;
        if (!aGroupAlias) {
          uVar3 = *__k;
          std::__cxx11::string::string((string *)&local_50,"not started",(allocator *)&importError);
          WarningMsg(this,uVar3,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
switchD_00228c78_caseD_0:
        __k = __k + 1;
      }
      bVar4 = Interpreter::IsInactiveCommissionerAllowed(this->mInterpreter,aExpr);
      if (bVar4) {
LAB_00228b5a:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&jobExpr,aExpr);
        if ((this->mImportFile)._M_string_length == 0) {
LAB_00228c13:
          CreateJob(&importError,this,(CommissionerAppPtr *)&iVar6._M_node[1]._M_parent,&jobExpr,
                    *__k);
          pEVar7 = Error::operator=(__return_storage_ptr__,&importError);
          EVar1 = pEVar7->mCode;
          std::__cxx11::string::~string((string *)&importError.mMessage);
          iVar8 = (uint)(EVar1 != kNone) << 2;
        }
        else {
          AppendImport(&importError,this,*__k,&jobExpr);
          EVar1 = importError.mCode;
          local_b0 = local_a0;
          local_a8 = 0;
          local_a0[0] = 0;
          std::__cxx11::string::~string((string *)&local_b0);
          if (EVar1 == kNone) {
            iVar8 = 0;
          }
          else {
            uVar3 = *__k;
            std::__cxx11::string::string((string *)&local_90,(string *)&importError.mMessage);
            ErrorMsg(this,uVar3,&local_90);
            std::__cxx11::string::~string((string *)&local_90);
            iVar8 = 8;
          }
          std::__cxx11::string::~string((string *)&importError.mMessage);
          if (EVar1 == kNone) goto LAB_00228c13;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&jobExpr);
      }
      else {
        bVar5 = (**(code **)(*(long *)iVar6._M_node[1]._M_parent + 0x78))();
        if (bVar5 == 0 && !aGroupAlias) {
          uVar3 = *__k;
          std::__cxx11::string::string((string *)&local_70,"not started",(allocator *)&importError);
          WarningMsg(this,uVar3,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          iVar8 = 8;
        }
        else {
          iVar8 = (uint)(bVar5 ^ 1) << 3;
        }
        if (bVar5 != 0) goto LAB_00228b5a;
      }
      switch(iVar8) {
      case 0:
      case 8:
        goto switchD_00228c78_caseD_0;
      case 4:
        return __return_storage_ptr__;
      default:
        goto switchD_00228c78_default;
      }
    }
    PrepareStopJobs(&importError,this,aExpr,aNids,aGroupAlias);
  }
  Error::operator=(__return_storage_ptr__,&importError);
  this_00 = (string *)&importError.mMessage;
switchD_00228c78_default:
  std::__cxx11::string::~string(this_00);
  return __return_storage_ptr__;
}

Assistant:

Error JobManager::PrepareJobs(const Interpreter::Expression &aExpr,
                              const std::vector<uint64_t>   &aNids,
                              bool                           aGroupAlias)
{
    Error error;

    if (utils::ToLower(aExpr[0]) == "start")
    {
        ExitNow(error = PrepareStartJobs(aExpr, aNids, aGroupAlias));
    }
    else if (utils::ToLower(aExpr[0]) == "stop")
    {
        ExitNow(error = PrepareStopJobs(aExpr, aNids, aGroupAlias));
    }

    for (const auto &nid : aNids)
    {
        auto entry = mCommissionerPool.find(nid);
        if (entry == mCommissionerPool.end())
        {
            if (!aGroupAlias)
            {
                WarningMsg(nid, "not started");
            }
            continue;
        }

        bool isInactiveAllowed = mInterpreter.IsInactiveCommissionerAllowed(aExpr);
        if (!isInactiveAllowed)
        {
            bool active = entry->second->IsActive();
            if (!active)
            {
                if (!aGroupAlias)
                {
                    WarningMsg(nid, "not started");
                }
                continue;
            }
        }

        Interpreter::Expression jobExpr = aExpr;

        if (!mImportFile.empty())
        {
            Error importError = AppendImport(nid, jobExpr);
            if (importError != ERROR_NONE)
            {
                ErrorMsg(nid, importError.GetMessage());
                continue;
            }
        }

        SuccessOrExit(error = CreateJob(entry->second, jobExpr, nid));
    }

exit:
    return error;
}